

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_binder_helpers.hpp
# Opt level: O3

disp_binding_activator_t * __thiscall
so_5::disp::reuse::
binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>
::bind_agent(disp_binding_activator_t *__return_storage_ptr__,
            binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>
            *this,environment_t *env,agent_ref_t *agent)

{
  atomic_refcounted_t *paVar1;
  anon_class_16_2_f78083f2 *in_R8;
  _Alloc_hider local_20;
  agent_t *local_18;
  
  local_18 = agent->m_obj;
  if (local_18 != (agent_t *)0x0) {
    LOCK();
    (local_18->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i =
         (local_18->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i
         + 1;
    UNLOCK();
  }
  local_20._M_p = (pointer)this;
  do_with_dispatcher<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,so_5::disp::reuse::binder_for_public_disp_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t,so_5::disp::prio_one_thread::quoted_round_robin::impl::binding_actions_mixin_t>::bind_agent(so_5::environment_t&,so_5::intrusive_ptr_t<so_5::agent_t>)::_lambda(so_5::disp::prio_one_thread::quoted_round_robin::impl::proxy_dispatcher_t&)_1_>
            (__return_storage_ptr__,(reuse *)env,(environment_t *)&this->m_disp_name,
             (string *)&local_20,in_R8);
  if (local_18 != (agent_t *)0x0) {
    LOCK();
    paVar1 = &local_18->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_18 != (agent_t *)0x0)) {
      (*local_18->_vptr_agent_t[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual disp_binding_activator_t
		bind_agent(
			environment_t & env,
			agent_ref_t agent ) override
			{
				return do_with_dispatcher< DISPATCHER >(
					env,
					m_disp_name,
					[this, agent]( DISPATCHER & disp )
					{
						return this->do_bind( disp, std::move( agent ) );
					} );
			}